

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O3

aom_codec_err_t av1_firstpass_info_move_cur_index_and_pop(FIRSTPASS_INFO *firstpass_info)

{
  int iVar1;
  aom_codec_err_t aVar2;
  
  aVar2 = AOM_CODEC_ERROR;
  if (1 < firstpass_info->future_stats_count) {
    firstpass_info->cur_index = (firstpass_info->cur_index + 1) % firstpass_info->stats_buf_size;
    firstpass_info->future_stats_count = firstpass_info->future_stats_count + -1;
    iVar1 = firstpass_info->past_stats_count;
    firstpass_info->past_stats_count = iVar1 + 1;
    if (-1 < iVar1 && 0 < firstpass_info->stats_count) {
      firstpass_info->start_index =
           (firstpass_info->start_index + 1) % firstpass_info->stats_buf_size;
      firstpass_info->stats_count = firstpass_info->stats_count + -1;
      firstpass_info->past_stats_count = iVar1;
      aVar2 = AOM_CODEC_OK;
    }
  }
  return aVar2;
}

Assistant:

aom_codec_err_t av1_firstpass_info_move_cur_index(
    FIRSTPASS_INFO *firstpass_info) {
  assert(firstpass_info->future_stats_count +
             firstpass_info->past_stats_count ==
         firstpass_info->stats_count);
  if (firstpass_info->future_stats_count > 1) {
    firstpass_info->cur_index =
        (firstpass_info->cur_index + 1) % firstpass_info->stats_buf_size;
    --firstpass_info->future_stats_count;
    ++firstpass_info->past_stats_count;
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_ERROR;
  }
}